

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

int ON_wString::CompareAttributeName(wchar_t *name1,wchar_t *name2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  wchar_t *pwVar4;
  
  if (name1 == name2) {
    return 0;
  }
  pwVar4 = name2;
  if (name2 != (wchar_t *)0x0 && name1 != (wchar_t *)0x0) {
    while( true ) {
      uVar1 = Internal_NameAttributeWideCharRank(*name1,SUB81(pwVar4,0));
      uVar2 = Internal_NameAttributeWideCharRank(*name2,SUB81(pwVar4,0));
      if ((uVar1 != uVar2) || (0xfffffffd < uVar1 - 1)) break;
      name1 = name1 + 1;
      name2 = name2 + 1;
    }
    if ((uVar2 & uVar1) != 0xffffffff) {
      if (uVar1 < uVar2) {
        return -1;
      }
      if (uVar1 >= uVar2 && uVar1 != uVar2) {
        return 1;
      }
      if (uVar1 == 0) {
        return 0;
      }
    }
  }
  iVar3 = ON_StringCompareOrdinalUTF32((ON__UINT32 *)name1,-1,(ON__UINT32 *)name2,-1,true);
  return iVar3;
}

Assistant:

int ON_wString::CompareAttributeName(
  const wchar_t* name1,
  const wchar_t* name2
  )
{
  if (name1 == name2)
    return 0;

  const bool bIgnoreCase = true;

  if ( nullptr != name1 && nullptr != name2 )
  {
    // Sort leading underbar before 'A'
    // https://mcneel.myjetbrains.com/youtrack/issue/RH-41224

    unsigned int rank1 = Internal_NameAttributeWideCharRank(*name1,bIgnoreCase);
    unsigned int rank2 = Internal_NameAttributeWideCharRank(*name2,bIgnoreCase);
    while (rank1 == rank2 && ON_UNSET_UINT_INDEX != rank1 && 0 != rank1)
    {
      name1++;
      name2++;
      rank1 = Internal_NameAttributeWideCharRank(*name1,bIgnoreCase);
      rank2 = Internal_NameAttributeWideCharRank(*name2,bIgnoreCase);
    }

    if (ON_UNSET_UINT_INDEX != rank1 || ON_UNSET_UINT_INDEX != rank2)
    {
      if (rank1 < rank2)
        return -1;
      if (rank1 > rank2)
        return 1;
      if (0 == rank1)
        return 0;
    }
  }

  // name1 or name2 is nullptr or begins with an unranked code point.
  return ON_wString::CompareOrdinal(name1, -1, name2, -1, bIgnoreCase);
}